

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

TokenType __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseSuffixForFloatLiteral
          (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
           *this)

{
  bool bVar1;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *this_local;
  
  bVar1 = UTF8Reader::advanceIfStartsWith<char_const*,char_const*>(&this->input,"f32i","_f32i","fi")
  ;
  if (bVar1) {
    this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  *)anon_var_dwarf_d4702;
  }
  else {
    bVar1 = UTF8Reader::advanceIfStartsWith<char_const*,char_const*>
                      (&this->input,"f64i","_f64i","i");
    if (bVar1) {
      this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    *)anon_var_dwarf_d470d;
    }
    else {
      bVar1 = UTF8Reader::advanceIfStartsWith<char_const*>(&this->input,"f64","_f64");
      if (bVar1) {
        this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)anon_var_dwarf_d4718;
      }
      else {
        bVar1 = UTF8Reader::advanceIfStartsWith<char_const*,char_const*,char_const*>
                          (&this->input,"f32","_f32","f","_f");
        if (bVar1) {
          this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)anon_var_dwarf_d4723;
        }
        else {
          this_local = (Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)anon_var_dwarf_d4718;
        }
      }
    }
  }
  return (TokenType)(char *)this_local;
}

Assistant:

TokenType parseSuffixForFloatLiteral()
    {
        if (input.advanceIfStartsWith ("f32i", "_f32i", "fi"))    return Token::literalImag32;
        if (input.advanceIfStartsWith ("f64i", "_f64i", "i"))     return Token::literalImag64;
        if (input.advanceIfStartsWith ("f64", "_f64"))            return Token::literalFloat64;
        if (input.advanceIfStartsWith ("f32", "_f32", "f", "_f")) return Token::literalFloat32;

        return Token::literalFloat64;
    }